

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::gather_slice_arg(int *argc,char **argv)

{
  bool bVar1;
  int x1;
  int y1;
  int x2;
  int y2;
  string *this;
  allocator<char> local_10c;
  allocator<char> local_10b;
  allocator<char> local_10a;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,argv[4],&local_109);
  bVar1 = isinteger(&local_108);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,argv[5],&local_10a);
    bVar1 = isinteger(&local_e8);
    if (!bVar1) {
LAB_0010a143:
      std::__cxx11::string::~string((string *)&local_e8);
      goto LAB_0010a14d;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,argv[6],&local_10b);
    bVar1 = isinteger(&local_c8);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&local_c8);
      goto LAB_0010a143;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,argv[7],&local_10c);
    bVar1 = isinteger(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,argv[4],(allocator<char> *)&local_e8);
      x1 = std::__cxx11::stoi(&local_108,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,argv[5],(allocator<char> *)&local_e8);
      y1 = std::__cxx11::stoi(&local_108,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,argv[6],(allocator<char> *)&local_e8);
      x2 = std::__cxx11::stoi(&local_108,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,argv[7],(allocator<char> *)&local_e8);
      y2 = std::__cxx11::stoi(&local_108,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,argv[2],(allocator<char> *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,argv[3],(allocator<char> *)&local_e8);
      execute_slice(&local_68,&local_88,x1,y1,x2,y2);
      std::__cxx11::string::~string((string *)&local_88);
      this = &local_68;
      goto LAB_0010a17c;
    }
  }
  else {
LAB_0010a14d:
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Invalid co-ordinates detected. Aborting.",
             (allocator<char> *)&local_108);
  print_ln(&local_a8);
  this = &local_a8;
LAB_0010a17c:
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void UI::gather_slice_arg(int &argc, char *argv[])
{
    if( (isinteger(argv[4]))
     && (isinteger(argv[5]))
     && (isinteger(argv[6]))
     && (isinteger(argv[7])) )
    {
        int x1 = std::stoi(argv[4]);
        int y1 = std::stoi(argv[5]);
        int x2 = std::stoi(argv[6]);
        int y2 = std::stoi(argv[7]);
        execute_slice(argv[2],argv[3],x1,y1,x2,y2);
    }
    else
    {
        print_ln("Invalid co-ordinates detected. Aborting.");
    }
}